

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O1

int fits_rebin_wcsd(fitsfile *fptr,int naxis,double *amin,double *binsize,int *status)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  int value;
  bool bVar4;
  int value_00;
  ulong uVar5;
  int tstatus;
  double dvalue;
  char svalue [71];
  char keyname [75];
  int local_12c;
  double local_128;
  double *local_120;
  ulong local_118;
  int local_10c;
  double *local_108;
  int *local_100;
  ulong local_f8;
  ulong local_f0;
  double local_e8;
  undefined8 uStack_e0;
  char local_d8 [80];
  char local_88 [88];
  
  if (*status < 1) {
    local_100 = status;
    if (0 < naxis) {
      local_f8 = (ulong)(uint)naxis;
      local_f0 = (ulong)(uint)-naxis;
      local_118 = 0;
      local_120 = binsize;
      local_108 = amin;
      do {
        local_12c = 0;
        uVar5 = local_118 + 1;
        value_00 = (int)uVar5;
        ffkeyn("CRVAL",value_00,local_88,&local_12c);
        ffgky(fptr,0x52,local_88,&local_128,(char *)0x0,&local_12c);
        local_10c = local_12c;
        local_e8 = local_128;
        uStack_e0 = 0;
        local_12c = 0;
        ffkeyn("CRPIX",value_00,local_88,&local_12c);
        ffgky(fptr,0x52,local_88,&local_128,(char *)0x0,&local_12c);
        bVar4 = true;
        if (local_12c == 0) {
          bVar4 = (local_128 != 1.0 || local_e8 != 1.0) || local_10c != 0;
          local_128 = (local_128 - local_108[local_118]) / local_120[local_118] + 0.5;
          ffmkyd(fptr,local_88,local_128,-0xe,(char *)0x0,&local_12c);
        }
        local_12c = 0;
        ffkeyn("CDELT",value_00,local_88,&local_12c);
        ffgky(fptr,0x52,local_88,&local_128,(char *)0x0,&local_12c);
        if (local_12c == 0) {
          bVar1 = local_128 == 1.0;
          local_128 = local_128 * local_120[local_118];
          ffmkyd(fptr,local_88,local_128,-0xe,(char *)0x0,&local_12c);
          if (bVar1 && !bVar4) {
            local_128 = 1.0;
            ffkeyn("CRPIX",value_00,local_88,&local_12c);
            ffmkyd(fptr,local_88,local_128,-0xe,(char *)0x0,&local_12c);
            ffkeyn("CRVAL",value_00,local_88,&local_12c);
            local_128 = local_120[local_118] * 0.5 + local_108[local_118];
            ffmkyd(fptr,local_88,local_128,-0xe,(char *)0x0,&local_12c);
          }
        }
        else {
          value = 1;
          do {
            local_12c = 0;
            ffkeyn("CD",value,local_d8,&local_12c);
            sVar3 = strlen(local_d8);
            (local_d8 + sVar3)[0] = '_';
            (local_d8 + sVar3)[1] = '\0';
            ffkeyn(local_d8,value_00,local_88,&local_12c);
            ffgky(fptr,0x52,local_88,&local_128,(char *)0x0,&local_12c);
            if (local_12c == 0) {
              local_128 = local_128 * local_120[local_118];
              ffmkyd(fptr,local_88,local_128,-0xe,(char *)0x0,&local_12c);
            }
            iVar2 = (int)local_f0 + value;
            value = value + 1;
          } while (iVar2 != 0);
        }
        local_118 = uVar5;
      } while (uVar5 != local_f8);
    }
    return *local_100;
  }
  return *status;
}

Assistant:

int fits_rebin_wcsd(
      fitsfile *fptr,   /* I - pointer to table to be binned           */
      int naxis,        /* I - number of axes in the histogram image   */
      double *amin,     /* I - first pixel include in each axis        */
      double *binsize,  /* I - binning factor for each axis            */
      int *status)      
{      
   /*  Update the  WCS keywords that define the location of the reference */
   /*  pixel, and the pixel size, along each axis.   */

    int ii, jj, tstatus, reset ;
    char keyname[FLEN_KEYWORD], svalue[FLEN_VALUE];
    double dvalue;
    
    if (*status > 0)
        return(*status);
  
    for (ii = 0; ii < naxis; ii++)
    {
       reset = 0;  /* flag to reset the reference pixel */
       tstatus = 0;
       ffkeyn("CRVAL", ii + 1, keyname, &tstatus);
       /* get previous (pre-binning) value */
       ffgky(fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus); 
       if (!tstatus && dvalue == 1.0) {
           reset = 1;
       }

       tstatus = 0;
       /*  CRPIXn - update location of the ref. pix. in the binned image */
       ffkeyn("CRPIX", ii + 1, keyname, &tstatus);

       /* get previous (pre-binning) value */
       ffgky(fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus); 

       if (!tstatus)
       {
           if (dvalue != 1.0)
	      reset = 0;

           /* updated value to give pixel location after binning */
           dvalue = (dvalue - amin[ii]) / ((double) binsize[ii]) + .5;  

           fits_modify_key_dbl(fptr, keyname, dvalue, -14, NULL, &tstatus);
       } else {
          reset = 0;
       }

       /*  CDELTn - update unit size of pixels  */
       tstatus = 0;
       ffkeyn("CDELT", ii + 1, keyname, &tstatus);

       /* get previous (pre-binning) value */
       ffgky(fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus); 

       if (!tstatus)
       {
           if (dvalue != 1.0)
	      reset = 0;

           /* updated to give post-binning value */
           dvalue = dvalue * binsize[ii];  

           fits_modify_key_dbl(fptr, keyname, dvalue, -14, NULL, &tstatus);
       }
       else
       {   /* no CDELTn keyword, so look for a CDij keywords */
          reset = 0;

          for (jj = 0; jj < naxis; jj++)
	  {
             tstatus = 0;
             ffkeyn("CD", jj + 1, svalue, &tstatus);
	     strcat(svalue,"_");
	     ffkeyn(svalue, ii + 1, keyname, &tstatus);

             /* get previous (pre-binning) value */
             ffgky(fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus); 

             if (!tstatus)
             {
                /* updated to give post-binning value */
               dvalue = dvalue * binsize[ii];  

               fits_modify_key_dbl(fptr, keyname, dvalue, -14, NULL, &tstatus);
             }
	  }
       }

       if (reset) {
          /* the original CRPIX, CRVAL, and CDELT keywords were all = 1.0 */
	  /* In this special case, reset the reference pixel to be the */
	  /* first pixel in the array (instead of possibly far off the array) */
 
           dvalue = 1.0;
           ffkeyn("CRPIX", ii + 1, keyname, &tstatus);
           fits_modify_key_dbl(fptr, keyname, dvalue, -14, NULL, &tstatus);

           ffkeyn("CRVAL", ii + 1, keyname, &tstatus);
	   dvalue = amin[ii] + (binsize[ii] / 2.0);	  
           fits_modify_key_dbl(fptr, keyname, dvalue, -14, NULL, &tstatus);
	}

    }
    return(*status);
}